

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

uint P_GetStackPortal(AActor *point,int plane)

{
  FSectorPortal *pFVar1;
  FSectorPortal *pFVar2;
  uint uVar3;
  AActor *pAVar4;
  
  uVar3 = TArray<FSectorPortal,_FSectorPortal>::Reserve(&sectorPortals,1);
  pFVar2 = sectorPortals.Array;
  pFVar1 = sectorPortals.Array + uVar3;
  pFVar1->mType = 0;
  pFVar1->mFlags = 0;
  pFVar1->mPartner = 0;
  pFVar1->mPlane = 0;
  pFVar2[uVar3].mOrigin = (sector_t *)0x0;
  (&pFVar2[uVar3].mOrigin)[1] = (sector_t *)0x0;
  pFVar2[uVar3].mDisplacement.X = 0.0;
  pFVar2[uVar3].mDisplacement.Y = 0.0;
  pFVar2[uVar3].mPlaneZ = 0.0;
  *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&pFVar2[uVar3].mPlaneZ + 1) =
       (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  pFVar2[uVar3].mType = 1;
  pFVar2[uVar3].mPlane = plane;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)&point->target);
  pFVar1 = sectorPortals.Array;
  sectorPortals.Array[uVar3].mOrigin = pAVar4->Sector;
  pFVar1[uVar3].mDestination = point->Sector;
  pFVar1[uVar3].mPlaneZ = 3.4028234663852886e+38;
  pFVar1[uVar3].mSkybox.field_0.p = point;
  return uVar3;
}

Assistant:

unsigned P_GetStackPortal(AActor *point, int plane)
{
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = PORTS_STACKEDSECTORTHING;
	sectorPortals[i].mPlane = plane;
	sectorPortals[i].mOrigin = point->target->Sector;
	sectorPortals[i].mDestination = point->Sector;
	sectorPortals[i].mPlaneZ = FLT_MAX;
	sectorPortals[i].mSkybox = point;
	return i;
}